

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_getOwnPropertyDescriptors(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue val;
  JSValue v_01;
  JSValue v_02;
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  undefined4 in_ECX;
  JSContext *in_RDX;
  JSPropertyEnum **in_RSI;
  uint32_t *in_RDI;
  undefined8 in_R8;
  JSValue JVar3;
  JSValue JVar4;
  JSValue JVar5;
  int in_stack_0000000c;
  JSValue *in_stack_00000010;
  int in_stack_0000001c;
  JSContext *in_stack_00000020;
  JSValue in_stack_00000028;
  JSValue args [2];
  JSValue desc;
  JSValue atomValue;
  uint32_t i;
  uint32_t len;
  JSPropertyEnum *props;
  JSObject *p;
  JSValue r;
  JSValue obj;
  undefined4 in_stack_fffffffffffffed8;
  JSAtom in_stack_fffffffffffffedc;
  JSContext *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int64_t in_stack_fffffffffffffef0;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  JSAtom prop;
  int64_t in_stack_ffffffffffffff38;
  undefined8 local_98;
  JSContext *in_stack_ffffffffffffff70;
  ulong in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 local_70;
  undefined4 local_6c;
  int flags;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  flags = (int)((ulong)in_R8 >> 0x20);
  JVar3.tag._0_4_ = 0;
  JVar3.u = (JSValueUnion)in_stack_ffffffffffffff78;
  JVar3.tag._4_4_ = in_stack_ffffffffffffff84;
  JVar3 = JS_ToObject(in_stack_ffffffffffffff70,JVar3);
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    iVar2 = JS_GetOwnPropertyNamesInternal
                      (in_RDX,in_RSI,in_RDI,(JSObject *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),
                       flags);
    if (iVar2 == 0) {
      JVar4 = JS_NewObject((JSContext *)0x1a91e9);
      local_98 = JVar4.tag;
      iVar2 = JS_IsException(JVar4);
      if (iVar2 == 0) {
        for (local_70 = 0; local_10 = JVar4.u._0_4_, local_70 < local_6c; local_70 = local_70 + 1) {
          JVar5 = JS_AtomToValue(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          local_f8 = JVar5.u;
          local_f0 = (JSValueUnion)JVar5.tag;
          iVar2 = JS_IsException(JVar5);
          if (iVar2 != 0) goto LAB_001a943c;
          in_stack_fffffffffffffee8 = 0;
          in_stack_fffffffffffffef0 = 3;
          prop = JVar3.tag._4_4_;
          JVar5 = js_object_getOwnPropertyDescriptor
                            (in_stack_00000020,in_stack_00000028,in_stack_0000001c,in_stack_00000010
                             ,in_stack_0000000c);
          local_108 = JVar5.u;
          local_100 = JVar5.tag;
          JVar5.u._4_4_ = in_stack_fffffffffffffeec;
          JVar5.u.int32 = in_stack_fffffffffffffee8;
          JVar5.tag = in_stack_fffffffffffffef0;
          JS_FreeValue(in_stack_fffffffffffffee0,JVar5);
          v_01.tag = local_100;
          v_01.u.ptr = local_108;
          iVar2 = JS_IsException(v_01);
          if (iVar2 != 0) goto LAB_001a943c;
          v_02.tag = local_100;
          v_02.u.ptr = local_108;
          iVar2 = JS_IsUndefined(v_02);
          if (iVar2 == 0) {
            in_stack_fffffffffffffed8 = 0x4007;
            this_obj.tag = local_100;
            this_obj.u.ptr = local_108;
            val.tag = in_stack_ffffffffffffff38;
            val.u.float64 = local_f0;
            iVar2 = JS_DefinePropertyValue((JSContext *)local_f8,this_obj,prop,val,local_10);
            if (iVar2 < 0) goto LAB_001a943c;
          }
        }
        js_free_prop_enum(in_stack_fffffffffffffee0,
                          (JSPropertyEnum *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0);
        v.u._4_4_ = in_stack_fffffffffffffeec;
        v.u.int32 = in_stack_fffffffffffffee8;
        v.tag = in_stack_fffffffffffffef0;
        JS_FreeValue(in_stack_fffffffffffffee0,v);
        uStack_c = JVar4.u._4_4_;
        local_8 = local_98;
        goto LAB_001a94a9;
      }
    }
LAB_001a943c:
    js_free_prop_enum(in_stack_fffffffffffffee0,
                      (JSPropertyEnum *)
                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0);
    JVar4.u._4_4_ = in_stack_fffffffffffffeec;
    JVar4.u.int32 = in_stack_fffffffffffffee8;
    JVar4.tag = in_stack_fffffffffffffef0;
    JS_FreeValue(in_stack_fffffffffffffee0,JVar4);
    v_00.u._4_4_ = in_stack_fffffffffffffeec;
    v_00.u.int32 = in_stack_fffffffffffffee8;
    v_00.tag = in_stack_fffffffffffffef0;
    JS_FreeValue(in_stack_fffffffffffffee0,v_00);
    local_10 = 0;
    local_8 = 6;
  }
  else {
    local_10 = 0;
    local_8 = 6;
  }
LAB_001a94a9:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_object_getOwnPropertyDescriptors(JSContext *ctx, JSValueConst this_val,
                                                   int argc, JSValueConst *argv)
{
    //getOwnPropertyDescriptors(obj)
    JSValue obj, r;
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;

    r = JS_UNDEFINED;
    obj = JS_ToObject(ctx, argv[0]);
    if (JS_IsException(obj))
        return JS_EXCEPTION;

    p = JS_VALUE_GET_OBJ(obj);
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p,
                               JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK))
        goto exception;
    r = JS_NewObject(ctx);
    if (JS_IsException(r))
        goto exception;
    for(i = 0; i < len; i++) {
        JSValue atomValue, desc;
        JSValueConst args[2];

        atomValue = JS_AtomToValue(ctx, props[i].atom);
        if (JS_IsException(atomValue))
            goto exception;
        args[0] = obj;
        args[1] = atomValue;
        desc = js_object_getOwnPropertyDescriptor(ctx, JS_UNDEFINED, 2, args, 0);
        JS_FreeValue(ctx, atomValue);
        if (JS_IsException(desc))
            goto exception;
        if (!JS_IsUndefined(desc)) {
            if (JS_DefinePropertyValue(ctx, r, props[i].atom, desc,
                                       JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    js_free_prop_enum(ctx, props, len);
    JS_FreeValue(ctx, obj);
    return r;

exception:
    js_free_prop_enum(ctx, props, len);
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, r);
    return JS_EXCEPTION;
}